

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-string-view.cc
# Opt level: O0

void __thiscall string_view_copy_Test::TestBody(string_view_copy_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_e0;
  Message local_d8;
  char local_cc [4];
  undefined1 local_c8 [8];
  AssertionResult gtest_ar_3;
  int i;
  Message local_a8;
  char local_99;
  undefined1 local_98 [8];
  AssertionResult gtest_ar_2;
  Message local_80;
  char local_71;
  undefined1 local_70 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_58;
  Message local_50;
  char local_41;
  undefined1 local_40 [8];
  AssertionResult gtest_ar;
  char acStack_28 [6];
  char buffer [10];
  string_view sv;
  string_view_copy_Test *this_local;
  
  wabt::string_view::string_view((string_view *)(buffer + 2),"words");
  memset((void *)((long)&gtest_ar.message_.ptr_ + 6),0,10);
  wabt::string_view::copy
            ((string_view *)(buffer + 2),(EVP_PKEY_CTX *)((long)&gtest_ar.message_.ptr_ + 6),
             (EVP_PKEY_CTX *)0xa);
  local_41 = 'r';
  testing::internal::EqHelper<false>::Compare<char,char>
            ((EqHelper<false> *)local_40,"\'r\'","buffer[0]",&local_41,
             (char *)((long)&gtest_ar.message_.ptr_ + 6));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar1) {
    testing::Message::Message(&local_50);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_40);
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/test-string-view.cc"
               ,0xdb,pcVar2);
    testing::internal::AssertHelper::operator=(&local_58,&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    testing::Message::~Message(&local_50);
  }
  gtest_ar_1.message_.ptr_._5_3_ = 0;
  gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
    local_71 = 'd';
    testing::internal::EqHelper<false>::Compare<char,char>
              ((EqHelper<false> *)local_70,"\'d\'","buffer[1]",&local_71,
               (char *)((long)&gtest_ar.message_.ptr_ + 7));
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
    if (!bVar1) {
      testing::Message::Message(&local_80);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_70);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/test-string-view.cc"
                 ,0xdc,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_80);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_80);
    }
    gtest_ar_1.message_.ptr_._5_3_ = 0;
    gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
    if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
      local_99 = 's';
      testing::internal::EqHelper<false>::Compare<char,char>
                ((EqHelper<false> *)local_98,"\'s\'","buffer[2]",&local_99,acStack_28);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
      if (!bVar1) {
        testing::Message::Message(&local_a8);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_98);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xffffffffffffff50,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/test-string-view.cc"
                   ,0xdd,pcVar2);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xffffffffffffff50,&local_a8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff50);
        testing::Message::~Message(&local_a8);
      }
      gtest_ar_1.message_.ptr_._5_3_ = 0;
      gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
      if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
        for (gtest_ar_3.message_.ptr_._4_4_ = 3; gtest_ar_3.message_.ptr_._4_4_ < 10;
            gtest_ar_3.message_.ptr_._4_4_ = gtest_ar_3.message_.ptr_._4_4_ + 1) {
          local_cc[0] = '\0';
          local_cc[1] = '\0';
          local_cc[2] = '\0';
          local_cc[3] = '\0';
          testing::internal::EqHelper<true>::Compare<int,char>
                    (local_c8,"0",(int *)"buffer[i]",local_cc,
                     acStack_28 + (long)gtest_ar_3.message_.ptr_._4_4_ + -2);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
          if (!bVar1) {
            testing::Message::Message(&local_d8);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c8);
            testing::internal::AssertHelper::AssertHelper
                      (&local_e0,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/test-string-view.cc"
                       ,0xdf,pcVar2);
            testing::internal::AssertHelper::operator=(&local_e0,&local_d8);
            testing::internal::AssertHelper::~AssertHelper(&local_e0);
            testing::Message::~Message(&local_d8);
          }
          gtest_ar_1.message_.ptr_._5_3_ = 0;
          gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
          if (gtest_ar_1.message_.ptr_._4_4_ != 0) {
            return;
          }
        }
      }
    }
  }
  return;
}

Assistant:

TEST(string_view, copy) {
  string_view sv("words");
  char buffer[10] = {0};

  sv.copy(buffer, 10, 2);
  ASSERT_EQ('r', buffer[0]);
  ASSERT_EQ('d', buffer[1]);
  ASSERT_EQ('s', buffer[2]);
  for (int i = 3; i < 10; ++i) {
    ASSERT_EQ(0, buffer[i]);
  }
}